

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosType.h
# Opt level: O2

void __thiscall adios2::helper::DimsArray::DimsArray(DimsArray *this,size_t count,size_t init)

{
  size_t *__s;
  size_t i;
  size_t sVar1;
  
  __s = this->Dimensions;
  (this->super_CoreDims).DimCount = count;
  (this->super_CoreDims).DimensSpan = __s;
  memset(__s,0,0x100);
  for (sVar1 = 0; count != sVar1; sVar1 = sVar1 + 1) {
    __s[sVar1] = init;
  }
  return;
}

Assistant:

DimsArray(const size_t count, const size_t init) : CoreDims(count, &Dimensions[0])
    {
        for (size_t i = 0; i < count; i++)
        {
            Dimensions[i] = init;
        }
    }